

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O3

void __thiscall CompressedArray::dump(CompressedArray *this,ostream *out)

{
  _Bit_type *p_Var1;
  byte bVar2;
  _Bit_type *p_Var3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint32_t blocks_count;
  uint32_t size;
  byte local_29;
  uint local_28;
  int local_24;
  
  std::ostream::write((char *)out,(long)&this->word_index_diff_log_radix);
  std::ostream::write((char *)out,(long)&this->context_index_diff_log_radix);
  std::ostream::write((char *)out,(long)&this->context_index_log_radix);
  std::ostream::write((char *)out,(long)&this->ngram_count_index_log_radix);
  std::ostream::write((char *)out,(long)&this->continuations_count_index_log_radix);
  std::ostream::write((char *)out,(long)&this->unique_continuations_count_index_log_radix);
  std::ostream::write((char *)out,(long)&this->record_count);
  Vocabulary<unsigned_int>::dump(&this->ngram_count_values,out);
  Vocabulary<unsigned_int>::dump(&this->continuations_count_values,out);
  Vocabulary<unsigned_int>::dump(&this->unique_continuations_count_values,out);
  local_28 = (uint)((ulong)((long)(this->headers).
                                  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->headers).
                                 super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::ostream::write((char *)out,(long)&local_28);
  if (local_28 != 0) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      std::ostream::write((char *)out,
                          (long)&(((this->headers).
                                   super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->key).word_index +
                          lVar6);
      std::ostream::write((char *)out,
                          (long)&(((this->headers).
                                   super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->key).context_index +
                          lVar6);
      std::ostream::write((char *)out,
                          (long)&((this->headers).
                                  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->offset + lVar6);
      std::ostream::write((char *)out,
                          (long)&((this->headers).
                                  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->record_index + lVar6);
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar4 < local_28);
  }
  local_24 = (*(int *)&(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             *(int *)&(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
             (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  std::ostream::write((char *)out,(long)&local_24);
  p_Var1 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  p_Var3 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar4 = (ulong)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (((long)p_Var3 - (long)p_Var1) * 8 + uVar4 != 0) {
    uVar5 = 0;
    do {
      bVar2 = 0;
      local_29 = 0;
      while( true ) {
        local_29 = ((p_Var1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) << (bVar2 & 0x1f) | local_29;
        if (bVar2 == 7) break;
        uVar5 = (ulong)((int)uVar5 + 1);
        bVar2 = bVar2 + 1;
        if (uVar4 + ((long)p_Var3 - (long)p_Var1) * 8 <= uVar5) {
          if (bVar2 == 0) {
            return;
          }
          std::ostream::write((char *)out,(long)&local_29);
          return;
        }
      }
      std::ostream::write((char *)out,(long)&local_29);
      p_Var1 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      p_Var3 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      uVar4 = (ulong)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < uVar4 + ((long)p_Var3 - (long)p_Var1) * 8);
  }
  return;
}

Assistant:

void CompressedArray::dump(ostream& out) const {
    out.write((char*)(&word_index_diff_log_radix), sizeof(word_index_diff_log_radix));
    out.write((char*)(&context_index_diff_log_radix), sizeof(context_index_diff_log_radix));
    out.write((char*)(&context_index_log_radix), sizeof(context_index_log_radix));
    out.write((char*)(&ngram_count_index_log_radix), sizeof(ngram_count_index_log_radix));
    out.write((char*)(&continuations_count_index_log_radix),
              sizeof(continuations_count_index_log_radix));
    out.write((char*)(&unique_continuations_count_index_log_radix),
              sizeof(unique_continuations_count_index_log_radix));

    out.write((char*)(&record_count), sizeof(record_count));

    ngram_count_values.dump(out);
    continuations_count_values.dump(out);
    unique_continuations_count_values.dump(out);

    uint32_t blocks_count = uint32_t(headers.size());
    out.write((char*)(&blocks_count), sizeof(blocks_count));
    for (uint32_t i = 0; i < blocks_count; i++) {
        out.write((char*)(&headers[i].key.word_index), sizeof(headers[i].key.word_index));
        out.write((char*)(&headers[i].key.context_index), sizeof(headers[i].key.context_index));
        out.write((char*)(&headers[i].offset), sizeof(headers[i].offset));
        out.write((char*)(&headers[i].record_index), sizeof(headers[i].record_index));
    }

    uint8_t buffer = 0;
    uint8_t idx = 0;
    uint32_t size = uint32_t(data.size());
    out.write((char*)(&size), sizeof(size));
    for (uint32_t i = 0; i < data.size(); i++) {
        buffer |= data[i] << idx;
        idx++;
        if (idx == 8) {
            out.write((char*)(&buffer), sizeof(buffer));
            idx = 0;
            buffer = 0;
        }
    }
    if (idx > 0)
        out.write((char*)(&buffer), sizeof(buffer));
}